

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O3

void free_speech(SPEECH_DATA *speech)

{
  SPEECH_DATA *pSVar1;
  SPEECH_DATA *pSVar2;
  long lVar3;
  
  free_pstring(speech->name);
  pSVar1 = speech->next;
  if (pSVar1 != (SPEECH_DATA *)0x0) {
    pSVar2 = speech->prev;
    if (pSVar2 == (SPEECH_DATA *)0x0) {
      lVar3 = 0x30;
      pSVar2 = speech;
    }
    else {
      pSVar2->next = pSVar1;
      lVar3 = 0x10;
      pSVar1 = pSVar2;
      pSVar2 = (SPEECH_DATA *)&speech->next;
    }
    *(SPEECH_DATA **)((long)&pSVar2->mob->next + lVar3) = pSVar1;
  }
  operator_delete(speech,0x30);
  return;
}

Assistant:

void free_speech(SPEECH_DATA *speech)
{
	free_pstring(speech->name);

	if (speech->next)
	{
		if (speech->prev)
		{
			speech->prev->next = speech->next;
			speech->next->prev = speech->prev;
		}
		else
		{
			speech->mob->speech = speech->next;
		}
	}

	delete speech;
}